

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O3

void QTest::qCaught(char *expected,char *what,char *file,int line)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QArrayData *local_50 [3];
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = " of type ";
  if (expected == (char *)0x0) {
    pcVar1 = "";
  }
  pcVar2 = "an";
  if (expected == (char *)0x0) {
    pcVar2 = "no";
    expected = "";
  }
  pcVar3 = "std::";
  if (what == (char *)0x0) {
    pcVar3 = "unknown ";
  }
  pcVar4 = " with message ";
  if (what == (char *)0x0) {
    pcVar4 = "";
    what = "";
  }
  QString::asprintf((char *)local_50,
                    "Expected %s exception%s%s to be thrown, but caught %sexception%s%s",pcVar2,
                    pcVar1,expected,pcVar3,pcVar4,what);
  QString::toUtf8_helper(&local_38);
  if (local_38.d.ptr == (char16_t *)0x0) {
    local_38.d.ptr = (char16_t *)&QByteArray::_empty;
  }
  QTestResult::fail((char *)local_38.d.ptr,file,line);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTest::qCaught(const char *expected, const char *what, const char *file, int line)
{
    auto message = [&] {
        const auto exType  = what ? "std::" : "unknown ";
        const auto ofType  = expected ? " of type " : "";
        const auto no      = expected ? "an" : "no";
        const auto withMsg = what ? " with message " : "";
        const auto protect = [](const char *s) { return s ? s : ""; };

        return QString::asprintf("Expected %s exception%s%s to be thrown, "
                                 "but caught %sexception%s%s",
                                 no, ofType, protect(expected),
                                 exType, withMsg, protect(what));
    };
    qFail(message().toUtf8().constData(), file, line);
}